

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O1

Tree vmergetree(Tree t1,Tree t2)

{
  int iVar1;
  uint uVar2;
  Branch *pBVar3;
  Branch *pBVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  Branch *pBVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  Tree TVar19;
  
  pBVar4 = t2.branch;
  pBVar9 = t1.branch;
  iVar15 = t1.deg;
  iVar6 = t2.deg;
  iVar17 = (iVar6 + iVar15) * 2;
  pBVar3 = (Branch *)malloc((long)(iVar17 + -2) * 0xc - 0x18);
  iVar8 = (int)((long)iVar6 + -1);
  if (1 < iVar15) {
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&pBVar3->x + lVar10) = *(undefined4 *)((long)&pBVar9->x + lVar10);
      *(undefined4 *)((long)&pBVar3->y + lVar10) = *(undefined4 *)((long)&pBVar9->y + lVar10);
      *(int *)((long)&pBVar3->n + lVar10) = *(int *)((long)&pBVar9->n + lVar10) + iVar8;
      lVar10 = lVar10 + 0xc;
    } while ((ulong)(iVar15 - 1) * 0xc != lVar10);
  }
  uVar2 = (iVar15 + iVar6) - 1;
  iVar12 = iVar15 * 2 + -3;
  lVar10 = (long)(iVar15 + -1);
  if (0 < iVar6) {
    lVar13 = lVar10 * 0xc;
    uVar7 = t2._0_8_ & 0xffffffff;
    do {
      *(undefined4 *)((long)&pBVar3->x + lVar13) =
           *(undefined4 *)((long)&pBVar4[1 - (long)iVar15].x + lVar13);
      *(undefined4 *)((long)&pBVar3->y + lVar13) =
           *(undefined4 *)((long)&pBVar4[1 - (long)iVar15].y + lVar13);
      *(int *)((long)&pBVar3->n + lVar13) =
           *(int *)((long)&pBVar4[1 - (long)iVar15].n + lVar13) + iVar12;
      lVar13 = lVar13 + 0xc;
      uVar14 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar14;
    } while (uVar14 != 0);
  }
  if (iVar6 + iVar15 <= (int)(uVar2 + iVar15 + -2)) {
    lVar13 = (long)(int)uVar2 * 0xc + 8;
    iVar16 = iVar15 + -2;
    do {
      *(undefined4 *)((long)pBVar3 + lVar13 + -8) =
           *(undefined4 *)((long)pBVar9 + lVar13 + (long)iVar8 * -0xc + -8);
      *(undefined4 *)((long)pBVar3 + lVar13 + -4) =
           *(undefined4 *)((long)pBVar9 + lVar13 + (long)iVar8 * -0xc + -4);
      *(int *)((long)&pBVar3->x + lVar13) = *(int *)((long)&pBVar9[-(long)iVar8].x + lVar13) + iVar8
      ;
      lVar13 = lVar13 + 0xc;
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
  }
  if ((int)(uVar2 + iVar15) <= iVar17 + -4) {
    lVar13 = (long)(int)(uVar2 + iVar15 + -2) * 0xc;
    iVar8 = iVar15 * 2 + -4;
    iVar15 = iVar6 + -2;
    do {
      *(undefined4 *)((long)&pBVar3->x + lVar13) =
           *(undefined4 *)((long)&pBVar4[-1 - (long)iVar8].x + lVar13);
      *(undefined4 *)((long)&pBVar3->y + lVar13) =
           *(undefined4 *)((long)pBVar4 + lVar13 + (long)iVar8 * -0xc + -8);
      *(int *)((long)&pBVar3->n + lVar13) =
           *(int *)((long)pBVar4 + lVar13 + (long)iVar8 * -0xc + -4) + iVar12;
      lVar13 = lVar13 + 0xc;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  uVar14 = t2.length + t1.length;
  uVar7 = (ulong)uVar14;
  iVar17 = iVar17 + -5;
  iVar8 = pBVar9[lVar10].n;
  iVar15 = pBVar9[iVar8].x;
  iVar12 = pBVar4[pBVar4->n].x;
  iVar16 = pBVar4->x;
  iVar1 = iVar12;
  if (iVar12 < iVar15) {
    iVar1 = iVar15;
  }
  if (iVar1 < iVar16) {
    pBVar3[iVar17].x = iVar1;
    uVar7 = (ulong)((uVar14 - iVar16) + iVar1);
  }
  else {
    if (iVar15 < iVar12) {
      iVar12 = iVar15;
    }
    if (iVar16 < iVar12) {
      pBVar3[iVar17].x = iVar12;
      uVar7 = (ulong)((uVar14 - iVar12) + iVar16);
    }
    else {
      pBVar3[iVar17].x = iVar16;
    }
  }
  pBVar3[iVar17].y = pBVar4->y;
  pBVar3[iVar17].n = pBVar3[lVar10].n;
  pBVar3[lVar10].n = iVar17;
  uVar11 = (long)iVar8 + (long)iVar6 + -1;
  piVar5 = &pBVar3[uVar11].n;
  iVar8 = iVar17;
  uVar14 = pBVar3[uVar11].n;
  if ((uint)uVar11 != pBVar3[uVar11].n) {
    do {
      iVar17 = (int)uVar11;
      uVar11 = (ulong)uVar14;
      *piVar5 = iVar8;
      piVar5 = &pBVar3[(int)uVar14].n;
      bVar18 = uVar14 != pBVar3[(int)uVar14].n;
      iVar8 = iVar17;
      uVar14 = pBVar3[(int)uVar14].n;
    } while (bVar18);
  }
  *piVar5 = iVar17;
  TVar19._0_8_ = (ulong)uVar2 | uVar7 << 0x20;
  TVar19.branch = pBVar3;
  return TVar19;
}

Assistant:

Tree vmergetree(Tree t1, Tree t2)
{
    int i, prev, curr, next, extra, offset1, offset2;
    DTYPE coord1, coord2;
    Tree t;

    t.deg = t1.deg + t2.deg - 1;
    t.length = t1.length + t2.length;
    t.branch = (Branch *) malloc((2*t.deg-2)*sizeof(Branch));
    offset1 = t2.deg-1;
    offset2 = 2*t1.deg-3;

    for (i=0; i<=t1.deg-2; i++) {
        t.branch[i].x = t1.branch[i].x;
        t.branch[i].y = t1.branch[i].y;
        t.branch[i].n = t1.branch[i].n + offset1;
    }
    for (i=t1.deg-1; i<=t.deg-1; i++) {
        t.branch[i].x = t2.branch[i-t1.deg+1].x;
        t.branch[i].y = t2.branch[i-t1.deg+1].y;
        t.branch[i].n = t2.branch[i-t1.deg+1].n + offset2;
    }
    for (i=t.deg; i<=t.deg+t1.deg-3; i++) {
        t.branch[i].x = t1.branch[i-offset1].x;
        t.branch[i].y = t1.branch[i-offset1].y;
        t.branch[i].n = t1.branch[i-offset1].n + offset1;
    }
    for (i=t.deg+t1.deg-2; i<=2*t.deg-4; i++) {
        t.branch[i].x = t2.branch[i-offset2].x;
        t.branch[i].y = t2.branch[i-offset2].y;
        t.branch[i].n = t2.branch[i-offset2].n + offset2;
    }
    extra = 2*t.deg-3;
    coord1 = t1.branch[t1.branch[t1.deg-1].n].x;
    coord2 = t2.branch[t2.branch[0].n].x;
    if (t2.branch[0].x > max(coord1, coord2)) {
        t.branch[extra].x = max(coord1, coord2);
        t.length -= t2.branch[0].x - t.branch[extra].x;
    }        
    else if (t2.branch[0].x < min(coord1, coord2)) {
        t.branch[extra].x = min(coord1, coord2);
        t.length -= t.branch[extra].x - t2.branch[0].x;
    }
    else t.branch[extra].x = t2.branch[0].x;
    t.branch[extra].y = t2.branch[0].y;
    t.branch[extra].n = t.branch[t1.deg-1].n;
    t.branch[t1.deg-1].n = extra;

    prev = extra;
    curr = t1.branch[t1.deg-1].n + offset1;
    next = t.branch[curr].n;
    while (curr != next) {
        t.branch[curr].n = prev;
        prev = curr;
        curr = next;
        next = t.branch[curr].n;
    }
    t.branch[curr].n = prev;

    return t;
}